

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_meta.cc
# Opt level: O2

void SelectiveBranchingMT::initialize(search *sch,size_t *param_2,options_i *options)

{
  typed_option<unsigned_long> *ptVar1;
  option_group_definition *this;
  size_t *psVar2;
  allocator local_38c;
  allocator local_38b;
  allocator local_38a;
  allocator local_389;
  size_t kbest;
  size_t max_branches;
  string local_378 [32];
  string local_358;
  string local_338 [32];
  string local_318;
  string local_2f8;
  option_group_definition new_options;
  typed_option<unsigned_long> local_2a0;
  typed_option<unsigned_long> local_200;
  typed_option<unsigned_long> local_160;
  typed_option<unsigned_long> local_c0;
  
  max_branches = 2;
  kbest = 0;
  std::__cxx11::string::string
            ((string *)&local_2f8,"selective branching options",(allocator *)&local_2a0);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::string((string *)&local_318,"search_max_branch",&local_389);
  VW::config::typed_option<unsigned_long>::typed_option(&local_2a0,&local_318,&max_branches);
  ptVar1 = VW::config::typed_option<unsigned_long>::default_value(&local_2a0,2);
  std::__cxx11::string::string(local_338,"maximum number of branches to consider",&local_38a);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_c0,ptVar1);
  this = VW::config::option_group_definition::add<unsigned_long>(&new_options,&local_c0);
  std::__cxx11::string::string((string *)&local_358,"search_kbest",&local_38b);
  VW::config::typed_option<unsigned_long>::typed_option(&local_200,&local_358,&kbest);
  ptVar1 = VW::config::typed_option<unsigned_long>::default_value(&local_200,0);
  std::__cxx11::string::string
            (local_378,
             "number of best items to output (0=just like non-selectional-branching, default)",
             &local_38c);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_160,ptVar1);
  VW::config::option_group_definition::add<unsigned_long>(this,&local_160);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_160);
  std::__cxx11::string::~string(local_378);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_200);
  std::__cxx11::string::~string((string *)&local_358);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_c0);
  std::__cxx11::string::~string(local_338);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_2a0);
  std::__cxx11::string::~string((string *)&local_318);
  (**options->_vptr_options_i)(options,&new_options);
  psVar2 = (size_t *)operator_new(0x90);
  *psVar2 = max_branches;
  psVar2[1] = kbest;
  psVar2[0x10] = 0;
  psVar2[0x11] = 0;
  psVar2[2] = 0;
  psVar2[3] = 0;
  psVar2[4] = 0;
  psVar2[5] = 0;
  psVar2[6] = 0;
  psVar2[7] = 0;
  psVar2[8] = 0;
  psVar2[9] = 0;
  psVar2[10] = 0;
  psVar2[0xb] = 0;
  psVar2[0xc] = 0;
  psVar2[0xd] = 0;
  sch->metatask_data = psVar2;
  VW::config::option_group_definition::~option_group_definition(&new_options);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& /*num_actions*/, options_i& options)
{
  size_t max_branches = 2;
  size_t kbest = 0;
  option_group_definition new_options("selective branching options");
  new_options
      .add(make_option("search_max_branch", max_branches)
               .default_value(2)
               .help("maximum number of branches to consider"))
      .add(make_option("search_kbest", kbest)
               .default_value(0)
               .help("number of best items to output (0=just like non-selectional-branching, default)"));
  options.add_and_parse(new_options);

  task_data* d = new task_data(max_branches, kbest);
  sch.set_metatask_data(d);
}